

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O3

void __thiscall
TStokesAnalytic::Sigma<Fad<double>>
          (TStokesAnalytic *this,TPZVec<Fad<double>_> *x,TPZFMatrix<Fad<double>_> *sigma)

{
  uint uVar1;
  double *pdVar2;
  ulong *puVar3;
  long lVar4;
  ulong uVar5;
  Fad<double> *pFVar6;
  Fad<double> *this_00;
  ulong uVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  Fad<double> p;
  TPZFMatrix<Fad<double>_> Du;
  TPZFMatrix<Fad<double>_> pIdentity;
  Fad<double> local_190;
  ulong local_170;
  Fad<double> *local_168;
  FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_> local_160;
  TPZFMatrix<Fad<double>_> local_150;
  TPZFMatrix<Fad<double>_> local_c0;
  
  lVar8 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar9 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181eb60;
  local_150.fElem = (Fad<double> *)0x0;
  local_150.fGiven = (Fad<double> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = lVar8;
  local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = lVar9;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ee50;
  local_150.fWork.fStore = (Fad<double> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar5 = lVar9 * lVar8;
  if (uVar5 != 0) {
    local_170 = 0xffffffffffffffff;
    if (uVar5 < 0x800000000000000) {
      local_170 = uVar5 * 0x20 + 8;
    }
    puVar3 = (ulong *)operator_new__(local_170);
    *puVar3 = uVar5;
    pFVar6 = (Fad<double> *)(puVar3 + 1);
    lVar8 = 0;
    local_168 = pFVar6;
    do {
      Fad<double>::Fad(pFVar6);
      lVar8 = lVar8 + -0x20;
      pFVar6 = pFVar6 + 1;
    } while (-lVar8 != uVar5 * 0x20);
    local_150.fElem = local_168;
  }
  lVar8 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar9 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0181eb60;
  local_c0.fElem = (Fad<double> *)0x0;
  local_c0.fGiven = (Fad<double> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = lVar8;
  local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = lVar9;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ee50;
  local_c0.fWork.fStore = (Fad<double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar5 = lVar9 * lVar8;
  pFVar6 = local_c0.fElem;
  if (uVar5 != 0) {
    uVar7 = 0xffffffffffffffff;
    if (uVar5 < 0x800000000000000) {
      uVar7 = uVar5 * 0x20 + 8;
    }
    puVar3 = (ulong *)operator_new__(uVar7);
    *puVar3 = uVar5;
    lVar8 = 0;
    this_00 = (Fad<double> *)(puVar3 + 1);
    do {
      Fad<double>::Fad(this_00);
      lVar8 = lVar8 + -0x20;
      this_00 = this_00 + 1;
      pFVar6 = (Fad<double> *)(puVar3 + 1);
    } while (-lVar8 != uVar5 * 0x20);
  }
  local_c0.fElem = pFVar6;
  local_190.val_ = 0.0;
  local_190.dx_.num_elts = 0;
  local_190.dx_.ptr_to_data = (double *)0x0;
  local_190.defaultVal = 0.0;
  Duxy<Fad<double>>(this,x,&local_150);
  if (0 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow) {
    lVar8 = 0;
    do {
      if (0 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol) {
        lVar9 = 0;
        do {
          if (local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar8) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          dVar10 = this->fvisco + this->fvisco;
          lVar4 = local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar9;
          local_150.fElem[lVar4 + lVar8].val_ = local_150.fElem[lVar4 + lVar8].val_ * dVar10;
          uVar1 = local_150.fElem[lVar4 + lVar8].dx_.num_elts;
          if (((ulong)uVar1 != 0) && (0 < (int)uVar1)) {
            pdVar2 = local_150.fElem[lVar4 + lVar8].dx_.ptr_to_data;
            uVar5 = 0;
            do {
              pdVar2[uVar5] = pdVar2[uVar5] * dVar10;
              uVar5 = uVar5 + 1;
            } while (uVar1 != uVar5);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  }
  pressure<Fad<double>>(this,x,&local_190);
  if (0 < local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow) {
    lVar8 = 0;
    do {
      pFVar6 = local_c0.fElem;
      if (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar8) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar9 = local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar8;
      local_c0.fElem[lVar9 + lVar8].val_ = local_190.val_;
      Vector<double>::operator=(&local_c0.fElem[lVar9 + lVar8].dx_,&local_190.dx_);
      pFVar6[lVar9 + lVar8].defaultVal = local_190.defaultVal;
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow);
  }
  lVar8 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar8) {
    lVar9 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
    lVar4 = 0;
    do {
      if (0 < lVar9) {
        lVar8 = 0;
        do {
          if ((local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar4) ||
             (local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar4) ||
             (local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_160.fadexpr_.left_ =
               local_150.fElem +
               local_150.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar8 + lVar4;
          local_160.fadexpr_.right_ =
               local_c0.fElem +
               local_c0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar8 + lVar4;
          lVar9 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar9 <= lVar4) ||
             ((sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Fad<double>::operator=(sigma->fElem + lVar9 * lVar8 + lVar4,&local_160);
          lVar8 = lVar8 + 1;
          lVar9 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
        } while (lVar8 < lVar9);
        lVar8 = (sigma->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar8);
  }
  Fad<double>::~Fad(&local_190);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TStokesAnalytic::Sigma(const TPZVec<TVar> &x, TPZFMatrix<TVar> &sigma) const
{
    TPZFMatrix<TVar> Du(sigma.Rows(),sigma.Cols()), pIdentity(sigma.Rows(),sigma.Cols());
    TVar p=0.;
    Duxy(x,Du);
    for(int i=0; i<Du.Rows(); i++)
    {
        for(int j=0; j<Du.Cols(); j++)
        {
            Du(i,j) *= 2.*fvisco;
        }
    }
    pressure(x, p);
    for (int i=0; i< pIdentity.Rows(); i++) {
        pIdentity(i,i) = p;
    }
    
    for(int i=0; i<sigma.Rows(); i++)
    {
        for(int j=0; j<sigma.Cols(); j++)
        {
            sigma(i,j) = Du(i,j)-pIdentity(i,j);
        }
    }

}